

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O3

void __thiscall agge::tests::RendererTests::SubpixelPrecisionShiftIsRespected(RendererTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer psVar3;
  pointer psVar4;
  int iVar5;
  long lVar6;
  int cover_1;
  int iVar7;
  int cover;
  uint uVar8;
  scanline_mockup sl;
  undefined8 local_c8;
  int aiStack_c0 [8];
  string local_a0;
  LocationInfo local_80;
  scanline_mockup local_58;
  
  local_58.excepted_y = -1000000;
  local_58.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._inprogress = true;
  local_58._current_y = 0x7fffffff;
  local_c8 = 0;
  aiStack_c0[0] = 0x11;
  aiStack_c0[1] = 0xb;
  aiStack_c0[2] = 0x1c00;
  aiStack_c0[3] = 0;
  aiStack_c0[4] = 0xd;
  aiStack_c0[5] = 0;
  aiStack_c0[6] = 0xffffffef;
  iVar7 = 0;
  lVar6 = 0;
  uVar8 = 0;
  do {
    iVar5 = 0;
    do {
      lVar2 = lVar6;
      lVar6 = lVar2 + 0xc;
      iVar5 = iVar5 + *(int *)((long)&local_c8 + lVar2 + 4);
      uVar8 = uVar8 + *(int *)((long)aiStack_c0 + lVar2);
      if (lVar6 == 0x24) break;
    } while (*(int *)((long)aiStack_c0 + lVar2 + 4) == iVar7);
    if (iVar5 != 0) {
      anon_unknown_1::scanline_mockup::add_cell(&local_58,iVar7,uVar8 * 0x100 - iVar5);
      iVar7 = iVar7 + 1;
    }
    if (lVar6 == 0x24) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_80,&local_a0,0x14c);
      psVar4 = local_58.spans_log.
               super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar3 = local_58.spans_log.
               super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ut::
      are_equal<agge::tests::(anonymous_namespace)::span,3ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                ((ut *)&DAT_001a1760,
                 (span (*) [3])
                 local_58.spans_log.
                 super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                  *)local_58.spans_log.
                    super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                    ._M_impl.super__Vector_impl_data._M_finish,&local_80);
      paVar1 = &local_80.filename.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.filename._M_dataplus._M_p != paVar1) {
        operator_delete(local_80.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if (psVar4 != psVar3) {
        local_58.spans_log.
        super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar3;
      }
      iVar7 = 0;
      lVar6 = 0;
      uVar8 = 0;
      do {
        iVar5 = 0;
        do {
          lVar2 = lVar6;
          lVar6 = lVar2 + 0xc;
          iVar5 = iVar5 + *(int *)((long)&local_c8 + lVar2 + 4);
          uVar8 = uVar8 + *(int *)((long)aiStack_c0 + lVar2);
          if (lVar6 == 0x24) break;
        } while (*(int *)((long)aiStack_c0 + lVar2 + 4) == iVar7);
        if (iVar5 != 0) {
          anon_unknown_1::scanline_mockup::add_cell(&local_58,iVar7,uVar8 * 0x800 - iVar5);
          iVar7 = iVar7 + 1;
        }
        if (lVar6 == 0x24) {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                     ,"");
          ut::LocationInfo::LocationInfo(&local_80,&local_a0,0x15b);
          psVar3 = local_58.spans_log.
                   super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ut::
          are_equal<agge::tests::(anonymous_namespace)::span,3ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                    ((ut *)&DAT_001a1790,
                     (span (*) [3])
                     local_58.spans_log.
                     super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                      *)local_58.spans_log.
                        super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.filename._M_dataplus._M_p != paVar1) {
            operator_delete(local_80.filename._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if (psVar3 != (pointer)0x0) {
            operator_delete(psVar3);
          }
          return;
        }
        iVar5 = *(int *)((long)aiStack_c0 + lVar2 + 4) - iVar7;
        if ((iVar5 != 0) && ((uVar8 & 0x1fffff) != 0)) {
          anon_unknown_1::scanline_mockup::add_span(&local_58,iVar7,iVar5,uVar8 * 0x800);
        }
        iVar7 = *(int *)((long)aiStack_c0 + lVar2 + 4);
      } while( true );
    }
    iVar5 = *(int *)((long)aiStack_c0 + lVar2 + 4) - iVar7;
    if ((iVar5 != 0) && ((uVar8 & 0xffffff) != 0)) {
      anon_unknown_1::scanline_mockup::add_span(&local_58,iVar7,iVar5,uVar8 * 0x100);
    }
    iVar7 = *(int *)((long)aiStack_c0 + lVar2 + 4);
  } while( true );
}

Assistant:

test( SubpixelPrecisionShiftIsRespected )
			{
				// INIT
				scanline_mockup sl;
				mocks::cell cells[] = { { 0, 0, 17 }, { 11, 14 * 512, 0 }, { 13, 0, -17 }, };

				// ACT
				sweep_scanline<7>(sl, begin(cells), end(cells), bypass_alpha());

				// ASSERT
				span reference1[] = {
					{ 0x7fffffff, 0, 11, 17 * 256 },
					{ 0x7fffffff, 11, 0, 17 * 256 - 14 * 512 },
					{ 0x7fffffff, 12, 1, 17 * 256 },
				};

				assert_equal(reference1, sl.spans_log);

				// INIT
				sl.spans_log.clear();

				// ACT
				sweep_scanline<10>(sl, begin(cells), end(cells), bypass_alpha());

				// ASSERT
				span reference2[] = {
					{ 0x7fffffff, 0, 11, 17 * 2048 },
					{ 0x7fffffff, 11, 0, 17 * 2048 - 14 * 512 },
					{ 0x7fffffff, 12, 1, 17 * 2048 },
				};

				assert_equal(reference2, sl.spans_log);
			}